

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

void ncnn::qsort_descent_inplace<ncnn::Rect>
               (vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> *datas,
               vector<float,_std::allocator<float>_> *scores,int left,int right)

{
  float *pfVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  pointer pfVar6;
  pointer pRVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int right_00;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  do {
    right_00 = right;
    iVar14 = left;
    if (left <= right) {
      fVar4 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_start[(right + left) / 2];
      do {
        pfVar6 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar15 = (long)iVar14 + -1;
        lVar17 = (long)iVar14 << 4;
        iVar12 = iVar14;
        do {
          iVar14 = iVar12;
          lVar13 = lVar17;
          lVar11 = lVar15 + 1;
          lVar15 = lVar15 + 1;
          lVar17 = lVar13 + 0x10;
          iVar12 = iVar14 + 1;
        } while (fVar4 < pfVar6[lVar11]);
        lVar17 = (long)right_00 + 1;
        lVar11 = (long)right_00 << 4;
        iVar12 = right_00;
        do {
          right_00 = iVar12;
          lVar16 = lVar11;
          pfVar1 = pfVar6 + lVar17 + -1;
          lVar17 = lVar17 + -1;
          lVar11 = lVar16 + -0x10;
          iVar12 = right_00 + -1;
        } while (*pfVar1 <= fVar4 && fVar4 != *pfVar1);
        if (lVar15 <= lVar17) {
          pRVar7 = (datas->super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar2 = (undefined8 *)((long)&pRVar7->x1 + lVar13);
          uVar8 = *puVar2;
          uVar9 = puVar2[1];
          puVar2 = (undefined8 *)((long)&pRVar7->x1 + lVar16);
          uVar10 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pRVar7->x1 + lVar13);
          *puVar3 = *puVar2;
          puVar3[1] = uVar10;
          puVar2 = (undefined8 *)((long)&pRVar7->x1 + lVar16);
          *puVar2 = uVar8;
          puVar2[1] = uVar9;
          pfVar6 = (scores->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          fVar5 = pfVar6[lVar15];
          pfVar6[lVar15] = pfVar6[lVar17];
          pfVar6[lVar17] = fVar5;
          right_00 = right_00 + -1;
          iVar14 = iVar14 + 1;
        }
      } while (iVar14 <= right_00);
    }
    if (left < right_00) {
      qsort_descent_inplace<ncnn::Rect>(datas,scores,left,right_00);
    }
    left = iVar14;
  } while (iVar14 < right);
  return;
}

Assistant:

static void qsort_descent_inplace(std::vector<T>& datas, std::vector<float>& scores, int left, int right)
{
    int i = left;
    int j = right;
    float p = scores[(left + right) / 2];

    while (i <= j)
    {
        while (scores[i] > p)
            i++;

        while (scores[j] < p)
            j--;

        if (i <= j)
        {
            // swap
            std::swap(datas[i], datas[j]);
            std::swap(scores[i], scores[j]);

            i++;
            j--;
        }
    }

    if (left < j)
        qsort_descent_inplace(datas, scores, left, j);

    if (i < right)
        qsort_descent_inplace(datas, scores, i, right);
}